

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandPool.cpp
# Opt level: O0

Ptr<CommandPool> myvk::CommandPool::Create(Ptr<Queue> *queue,VkCommandPoolCreateFlags flags)

{
  PFN_vkCreateCommandPool p_Var1;
  VkResult VVar2;
  element_type *peVar3;
  element_type *this;
  VkDevice pVVar4;
  element_type *peVar5;
  VkCommandPoolCreateFlags in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ptr<CommandPool> PVar6;
  VkCommandPoolCreateInfo create_info;
  shared_ptr<myvk::CommandPool> ret;
  shared_ptr<myvk::CommandPool> *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  VkCommandPoolCreateInfo local_48 [2];
  VkCommandPoolCreateFlags local_14;
  
  local_14 = in_EDX;
  std::make_shared<myvk::CommandPool>();
  std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b37c4);
  std::shared_ptr<myvk::Queue>::operator=
            ((shared_ptr<myvk::Queue> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (shared_ptr<myvk::Queue> *)in_stack_ffffffffffffff58);
  local_48[0].pNext = (void *)0x0;
  local_48[0].flags = 0;
  local_48[0].queueFamilyIndex = 0;
  local_48[0].sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_48[0]._4_4_ = 0;
  std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x2b37fb)
  ;
  local_48[0].queueFamilyIndex = Queue::GetFamilyIndex((Queue *)0x2b3803);
  p_Var1 = vkCreateCommandPool;
  local_48[0].flags = local_14;
  peVar3 = std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x2b3838);
  (*(peVar3->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  this = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x2b3855);
  pVVar4 = Device::GetHandle(this);
  peVar5 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2b3871);
  VVar2 = (*p_Var1)(pVVar4,local_48,(VkAllocationCallbacks *)0x0,&peVar5->m_command_pool);
  if (VVar2 == VK_SUCCESS) {
    std::shared_ptr<myvk::CommandPool>::shared_ptr
              ((shared_ptr<myvk::CommandPool> *)(ulong)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
  }
  else {
    std::shared_ptr<myvk::CommandPool>::shared_ptr
              ((shared_ptr<myvk::CommandPool> *)CONCAT44(VVar2,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
  }
  std::shared_ptr<myvk::CommandPool>::~shared_ptr((shared_ptr<myvk::CommandPool> *)0x2b38f6);
  PVar6.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar6.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<CommandPool>)PVar6.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<CommandPool> CommandPool::Create(const Ptr<Queue> &queue, VkCommandPoolCreateFlags flags) {
	auto ret = std::make_shared<CommandPool>();
	ret->m_queue_ptr = queue;

	VkCommandPoolCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
	create_info.queueFamilyIndex = queue->GetFamilyIndex();
	create_info.flags = flags;
	if (vkCreateCommandPool(queue->GetDevicePtr()->GetHandle(), &create_info, nullptr, &ret->m_command_pool) !=
	    VK_SUCCESS)
		return nullptr;
	return ret;
}